

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file,
          bool immutable,bool kotlin)

{
  undefined3 in_register_00000081;
  string local_30;
  
  if (CONCAT31(in_register_00000081,kotlin) == 0) {
    if (immutable) {
      GetFileImmutableClassName_abi_cxx11_(__return_storage_ptr__,this,file);
      return __return_storage_ptr__;
    }
    GetFileImmutableClassName_abi_cxx11_(&local_30,this,file);
    std::operator+(__return_storage_ptr__,"Mutable",&local_30);
  }
  else {
    GetFileImmutableClassName_abi_cxx11_(&local_30,this,file);
    std::operator+(__return_storage_ptr__,&local_30,"Kt");
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetFileClassName(const FileDescriptor* file,
                                                bool immutable, bool kotlin) {
  if (kotlin) {
    return GetFileImmutableClassName(file) + "Kt";
  } else if (immutable) {
    return GetFileImmutableClassName(file);
  } else {
    return "Mutable" + GetFileImmutableClassName(file);
  }
}